

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_gc.c
# Opt level: O0

void zt_gc_destroy(zt_gc_t *gc)

{
  int *in_RDI;
  zt_gc_t *unaff_retaddr;
  zt_elist_t *dont_use;
  zt_elist *local_10;
  
  if (*in_RDI != 0) {
    printf("# Warning: destroying gc while gc is disabled\n");
    *in_RDI = 0;
  }
  zt_gc_collect(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  zt_gc_destroy::elt = *(zt_elist_t **)(*(long *)(in_RDI + 0x1a) + 8);
  local_10 = zt_gc_destroy::elt->next;
  while (zt_gc_destroy::elt != *(zt_elist_t **)(in_RDI + 0x1a)) {
    zt_elist_remove((zt_elist_t *)0x108f6d);
    (**(code **)(in_RDI + 0x22))(in_RDI,*(undefined8 *)(in_RDI + 0x1e),&zt_gc_destroy::elt);
    zt_gc_destroy::elt = local_10;
    local_10 = local_10->next;
  }
  zt_gc_destroy::elt = *(zt_elist_t **)(*(long *)(in_RDI + 0x18) + 8);
  local_10 = zt_gc_destroy::elt->next;
  while (zt_gc_destroy::elt != *(zt_elist_t **)(in_RDI + 0x18)) {
    zt_elist_remove((zt_elist_t *)0x108fee);
    (**(code **)(in_RDI + 0x22))(in_RDI,*(undefined8 *)(in_RDI + 0x1e),&zt_gc_destroy::elt);
    zt_gc_destroy::elt = local_10;
    local_10 = local_10->next;
  }
  zt_gc_destroy::elt = *(zt_elist_t **)(*(long *)(in_RDI + 0x16) + 8);
  local_10 = zt_gc_destroy::elt->next;
  while (zt_gc_destroy::elt != *(zt_elist_t **)(in_RDI + 0x16)) {
    zt_elist_remove((zt_elist_t *)0x10906f);
    (**(code **)(in_RDI + 0x22))(in_RDI,*(undefined8 *)(in_RDI + 0x1e),&zt_gc_destroy::elt);
    zt_gc_destroy::elt = local_10;
    local_10 = local_10->next;
  }
  *in_RDI = 1;
  return;
}

Assistant:

void
zt_gc_destroy(zt_gc_t *gc)
{
    static zt_elist_t * elt;
    zt_elist_t * dont_use;

    if (gc->enabled != 0) {
        printf("# Warning: destroying gc while gc is disabled\n");
        gc->enabled = 0;
    }

    zt_gc_collect(gc, TRUE);

    zt_elist_for_each_safe(gc->white, elt, dont_use) {
        zt_elist_remove(elt);
        gc->release_fn(gc, gc->private_data, (void **)&elt);
    }

    zt_elist_for_each_safe(gc->grey, elt, dont_use) {
        zt_elist_remove(elt);
        gc->release_fn(gc, gc->private_data, (void **)&elt);
    }

    zt_elist_for_each_safe(gc->black, elt, dont_use) {
        zt_elist_remove(elt);
        gc->release_fn(gc, gc->private_data, (void **)&elt);
    }

    gc->enabled = 1;
}